

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heterogeneous_queue_basic_tests.cpp
# Opt level: O0

void density_tests::
     SpQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0>::
     spinlocking_heterogeneous_queue_basic_nonpolymorphic_base_tests(void)

{
  bool bVar1;
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  *prVar2;
  NonPolymorphicBase *this;
  SingleDerivedNonPoly *this_00;
  consume_operation consume;
  SpHeterQueue<RunTimeType> queue;
  consume_operation local_130;
  NonPolymorphicBase local_108;
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  local_100;
  
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::sp_heter_queue(&local_100);
  local_108 = (NonPolymorphicBase)0x0;
  NonPolymorphicBase::NonPolymorphicBase(&local_108);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::push<density_tests::NonPolymorphicBase>(&local_100,&local_108);
  NonPolymorphicBase::~NonPolymorphicBase(&local_108);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::emplace<density_tests::SingleDerivedNonPoly>(&local_100);
  SpQueueBasicTests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::
  dynamic_push_3<density_tests::NonPolymorphicBase,density::sp_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
            (&local_100);
  SpQueueBasicTests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::
  dynamic_push_3<density_tests::SingleDerivedNonPoly,density::sp_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
            (&local_100);
  do {
    density::
    sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::try_start_consume(&local_130,&local_100);
    bVar1 = density::sp_heter_queue::consume_operation::operator_cast_to_bool
                      ((consume_operation *)&local_130);
    if (bVar1) {
      prVar2 = density::
               sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
               ::consume_operation::complete_type(&local_130);
      bVar1 = density::
              runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
              ::is<density_tests::NonPolymorphicBase>(prVar2);
      if (bVar1) {
        this = density::
               sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
               ::consume_operation::element<density_tests::NonPolymorphicBase>(&local_130);
        NonPolymorphicBase::check(this);
      }
      else {
        prVar2 = density::
                 sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                 ::consume_operation::complete_type(&local_130);
        bVar1 = density::
                runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                ::is<density_tests::SingleDerivedNonPoly>(prVar2);
        if (!bVar1) {
          detail::assert_failed<>
                    ("consume.complete_type().template is<SingleDerivedNonPoly>()",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/sp_heterogeneous_queue_basic_tests.cpp"
                     ,0x95);
        }
        this_00 = density::
                  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                  ::consume_operation::element<density_tests::SingleDerivedNonPoly>(&local_130);
        SingleDerivedNonPoly::check(this_00);
      }
      density::
      sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::consume_operation::commit(&local_130);
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
    density::
    sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::consume_operation::~consume_operation(&local_130);
  } while (!bVar1);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
          ::empty(&local_100);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/sp_heterogeneous_queue_basic_tests.cpp"
               ,0x9b);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue(&local_100);
  return;
}

Assistant:

static void spinlocking_heterogeneous_queue_basic_nonpolymorphic_base_tests()
        {
            using namespace density;

            using RunTimeType = runtime_type<
              f_default_construct,
              f_move_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment>;
            SpHeterQueue<RunTimeType> queue;

            queue.push(NonPolymorphicBase());
            queue.template emplace<SingleDerivedNonPoly>();

            dynamic_push_3<NonPolymorphicBase>(queue);
            dynamic_push_3<SingleDerivedNonPoly>(queue);

            for (;;)
            {
                auto consume = queue.try_start_consume();
                if (!consume)
                    break;

                if (consume.complete_type().template is<NonPolymorphicBase>())
                {
                    consume.template element<NonPolymorphicBase>().check();
                }
                else
                {
                    DENSITY_TEST_ASSERT(
                      consume.complete_type().template is<SingleDerivedNonPoly>());
                    consume.template element<SingleDerivedNonPoly>().check();
                }
                consume.commit();
            }

            DENSITY_TEST_ASSERT(queue.empty());
        }